

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  uchar *puVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  size_t sVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint *bitlen;
  ulong uVar16;
  byte bVar17;
  uint uVar18;
  int iVar19;
  uint *puVar20;
  undefined1 (*pauVar21) [32];
  uint *puVar22;
  undefined1 (*__s) [32];
  long lVar23;
  undefined1 (*bitlen_00) [32];
  ulong __n;
  long lVar24;
  ulong uVar25;
  char cVar26;
  long lVar27;
  uint uVar28;
  int iVar29;
  ucvector *p;
  bool bVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar36 [64];
  HuffmanTree tree_ll;
  LodePNGBitReader local_150;
  undefined1 (*local_128) [32];
  ucvector *local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  uint local_100;
  uint local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  undefined1 local_d0 [16];
  ulong local_b8;
  LodePNGDecompressSettings *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_90 [16];
  undefined1 local_78 [32];
  undefined1 local_58 [16];
  undefined1 local_40 [16];
  
  local_150.bitsize = insize * 8;
  uVar13 = 0x69;
  if (local_150.bitsize < 0xffffffffffffffc0 && insize >> 0x3d == 0) {
    local_150.bp = 0;
    local_150.buffer = 0;
    uVar13 = 0;
    local_f8 = 0x8000000000000000;
    uStack_f0 = 0x8000000000000000;
    local_78._8_8_ = 0x8000000000000000;
    local_78._0_8_ = 0x8000000000000000;
    local_78._16_8_ = 0x8000000000000000;
    local_78._24_8_ = 0x8000000000000000;
    uVar28 = 0;
    uVar14 = 0;
    local_150.data = in;
    local_150.size = insize;
    local_120 = out;
    local_b0 = settings;
    do {
      if (uVar28 != 0) {
        return uVar14;
      }
      in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
      uVar12 = ensureBits9(&local_150,3);
      sVar11 = local_150.size;
      if (uVar12 == 0) {
        uVar13 = 0x34;
LAB_00126ef8:
        bVar30 = false;
      }
      else {
        uVar28 = local_150.buffer & 1;
        uVar12 = local_150.buffer >> 1 & 3;
        local_150.buffer = local_150.buffer >> 3;
        uVar16 = local_150.bp + 3;
        if (uVar12 == 3) {
          uVar13 = 0x14;
          local_150.bp = uVar16;
          goto LAB_00126ef8;
        }
        local_100 = uVar28;
        local_fc = uVar13;
        if (uVar12 == 0) {
          uVar15 = local_150.bp + 10 >> 3;
          uVar25 = uVar15 + 4;
          uVar14 = 0x34;
          local_150.bp = uVar16;
          if (uVar25 < local_150.size) {
            uVar2 = *(ushort *)(local_150.data + uVar15);
            __n = (ulong)uVar2;
            if ((local_b0->ignore_nlen != 0) ||
               (uVar14 = 0x15,
               (uint)*(ushort *)(local_150.data + uVar15 + 2) + (uint)uVar2 == 0xffff)) {
              uVar13 = ucvector_resize(local_120,local_120->size + __n);
              if (uVar13 == 0) {
                uVar14 = 0x53;
              }
              else {
                uVar14 = 0x17;
                if (uVar25 + __n <= sVar11) {
                  if (uVar2 != 0) {
                    memcpy(local_120->data + (local_120->size - __n),local_150.data + uVar25,__n);
                  }
                  local_150.bp = (uVar25 + __n) * 8;
                  uVar14 = 0;
                }
              }
            }
          }
        }
        else {
          local_e8 = (undefined1  [16])0x0;
          local_d0 = (undefined1  [16])0x0;
          local_a8 = (undefined1  [16])0x0;
          local_90 = (undefined1  [16])0x0;
          if (uVar12 == 1) {
            local_150.bp = uVar16;
            uVar14 = generateFixedLitLenTree((HuffmanTree *)local_e8);
            p = local_120;
            if (uVar14 == 0) {
              uVar14 = generateFixedDistanceTree((HuffmanTree *)local_a8);
            }
          }
          else {
            local_150.bp = uVar16;
            uVar14 = ensureBits17(&local_150,0xe);
            uVar13 = local_150.buffer;
            if (uVar14 == 0) {
              uVar14 = 0x31;
              p = local_120;
            }
            else {
              local_150.buffer = local_150.buffer >> 0xe;
              uVar16 = local_150.bp + 0xe;
              local_150.bp = uVar16;
              bitlen = (uint *)malloc(0x4c);
              auVar35 = in_ZMM6._0_16_;
              if (bitlen == (uint *)0x0) {
                uVar14 = 0x53;
                p = local_120;
              }
              else {
                uVar28 = uVar13 >> 10 & 0xf;
                pauVar21 = (undefined1 (*) [32])((ulong)uVar28 + 4);
                local_58 = (undefined1  [16])0x0;
                local_40 = (undefined1  [16])0x0;
                uVar25 = (long)pauVar21 * 3 + uVar16;
                uVar14 = 0x32;
                if (uVar25 < uVar16) {
LAB_00127296:
                  __s = (undefined1 (*) [32])0x0;
                  bitlen_00 = (undefined1 (*) [32])0x0;
                }
                else {
                  __s = (undefined1 (*) [32])0x0;
                  bitlen_00 = (undefined1 (*) [32])0x0;
                  if (uVar25 <= local_150.bitsize) {
                    local_110 = (ulong)(uVar13 & 0x1f);
                    local_108 = local_110 + 0x101;
                    local_b8 = (ulong)((uVar13 >> 5 & 0x1f) + 1);
                    uVar16 = (ulong)(uVar28 << 2);
                    lVar23 = 0;
                    local_128 = pauVar21;
                    local_118 = (ulong)(uVar13 >> 10);
                    do {
                      ensureBits9(&local_150,3);
                      uVar13 = local_150.buffer & 7;
                      local_150.buffer = local_150.buffer >> 3;
                      local_150.bp = local_150.bp + 3;
                      bitlen[*(uint *)((long)CLCL_ORDER + lVar23)] = uVar13;
                      lVar23 = lVar23 + 4;
                    } while (uVar16 + 0x10 != lVar23);
                    auVar35 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
                    if ((int)local_128 != 0x13) {
                      uVar13 = ~(uint)local_118 & 0xf;
                      lVar23 = (ulong)uVar13 - 1;
                      auVar33._8_8_ = lVar23;
                      auVar33._0_8_ = lVar23;
                      auVar32._16_8_ = lVar23;
                      auVar32._0_16_ = auVar33;
                      auVar32._24_8_ = lVar23;
                      auVar7._8_8_ = uStack_f0;
                      auVar7._0_8_ = local_f8;
                      auVar4 = auVar33 ^ auVar7;
                      uVar25 = 0;
                      do {
                        auVar34._8_8_ = uVar25;
                        auVar34._0_8_ = uVar25;
                        auVar34._16_8_ = uVar25;
                        auVar34._24_8_ = uVar25;
                        auVar6 = vpor_avx2(auVar34,_DAT_001dfc80);
                        auVar3._8_8_ = uStack_f0;
                        auVar3._0_8_ = local_f8;
                        auVar3 = vpcmpgtq_avx(auVar6._0_16_ ^ auVar3,auVar4);
                        auVar3 = vpackssdw_avx(auVar3,auVar3);
                        auVar3 = vpackssdw_avx(auVar3 ^ auVar35,auVar3 ^ auVar35);
                        if ((auVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          bitlen[*(uint *)(uVar16 + 0x1e1050 + uVar25 * 4)] = 0;
                        }
                        auVar8._8_8_ = uStack_f0;
                        auVar8._0_8_ = local_f8;
                        auVar3 = vpcmpgtq_avx(auVar6._0_16_ ^ auVar8,auVar4);
                        auVar3 = vpackssdw_avx(auVar3,auVar3);
                        auVar3 = vpackssdw_avx(auVar3 ^ auVar35,auVar3 ^ auVar35);
                        if ((auVar3 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          bitlen[*(uint *)(uVar16 + 0x1e1054 + uVar25 * 4)] = 0;
                        }
                        auVar5 = vpcmpgtq_avx2(auVar6 ^ local_78,auVar32 ^ local_78);
                        auVar31 = ZEXT1632(auVar4);
                        auVar6 = vpackssdw_avx2(auVar5,auVar31);
                        auVar3 = auVar6._16_16_ ^ auVar35;
                        auVar3 = vpackssdw_avx(auVar3,auVar3);
                        if ((auVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          bitlen[*(uint *)(uVar16 + 0x1e1058 + uVar25 * 4)] = 0;
                        }
                        auVar6 = vpackssdw_avx2(auVar5,auVar31);
                        auVar3 = auVar6._16_16_ ^ auVar35;
                        auVar3 = vpackssdw_avx(auVar3,auVar3);
                        if ((auVar3 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          bitlen[*(uint *)(uVar16 + 0x1e105c + uVar25 * 4)] = 0;
                        }
                        auVar6 = vpor_avx2(auVar34,_DAT_001dffa0);
                        auVar9._8_8_ = uStack_f0;
                        auVar9._0_8_ = local_f8;
                        auVar3 = vpcmpgtq_avx(auVar6._0_16_ ^ auVar9,auVar33 ^ auVar7);
                        auVar3 = vpackssdw_avx(auVar3,auVar3);
                        auVar3 = vpackssdw_avx(auVar3 ^ auVar35,auVar3 ^ auVar35);
                        if ((auVar3 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          bitlen[*(uint *)(uVar16 + 0x1e1060 + uVar25 * 4)] = 0;
                        }
                        auVar10._8_8_ = uStack_f0;
                        auVar10._0_8_ = local_f8;
                        auVar3 = vpcmpgtq_avx(auVar6._0_16_ ^ auVar10,auVar33 ^ auVar7);
                        auVar3 = vpackssdw_avx(auVar3,auVar3);
                        auVar3 = vpackssdw_avx(auVar3 ^ auVar35,auVar3 ^ auVar35);
                        if ((auVar3 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          bitlen[*(uint *)(uVar16 + 0x1e1064 + uVar25 * 4)] = 0;
                        }
                        auVar34 = vpcmpgtq_avx2(auVar6 ^ local_78,auVar32 ^ local_78);
                        auVar6 = vpackssdw_avx2(auVar31,auVar34);
                        auVar3 = auVar6._16_16_ ^ auVar35;
                        auVar3 = vpackssdw_avx(auVar3,auVar3);
                        if ((auVar3 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          bitlen[*(uint *)(uVar16 + 0x1e1068 + uVar25 * 4)] = 0;
                        }
                        auVar6 = vpshufhw_avx2(auVar34,0x84);
                        auVar3 = auVar6._16_16_ ^ auVar35;
                        auVar3 = vpackssdw_avx(auVar3,auVar3);
                        if ((auVar3 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          bitlen[*(uint *)(uVar16 + 0x1e106c + uVar25 * 4)] = 0;
                        }
                        uVar25 = uVar25 + 8;
                      } while ((uVar13 + 7 & 0xfffffff8) != uVar25);
                    }
                    auVar36 = ZEXT1664(auVar35);
                    uVar14 = HuffmanTree_makeFromLengths((HuffmanTree *)local_58,bitlen,0x13,7);
                    auVar35 = auVar36._0_16_;
                    if (uVar14 != 0) goto LAB_00127296;
                    __s = (undefined1 (*) [32])malloc(0x480);
                    bitlen_00 = (undefined1 (*) [32])malloc(0x80);
                    auVar35 = auVar36._0_16_;
                    uVar14 = 0x53;
                    if (bitlen_00 != (undefined1 (*) [32])0x0 && __s != (undefined1 (*) [32])0x0) {
                      uVar14 = 0;
                      local_128 = __s;
                      memset(__s,0,0x480);
                      auVar32 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                      *bitlen_00 = auVar32;
                      bitlen_00[1] = auVar32;
                      bitlen_00[2] = auVar32;
                      bitlen_00[3] = auVar32;
                      uVar28 = (int)local_b8 + (int)local_108;
                      uVar25 = (ulong)uVar28;
                      local_118 = CONCAT44(local_118._4_4_,(int)local_110 + 0x102);
                      uVar13 = -(int)local_110;
                      local_110 = (ulong)uVar13;
                      iVar29 = uVar13 - 0x101;
                      uVar16 = 0;
                      do {
                        auVar35 = auVar36._0_16_;
                        uVar13 = (uint)uVar16;
                        if (uVar28 <= uVar13) break;
                        uVar15 = local_150.bp >> 3;
                        if (uVar15 + 3 < local_150.size) {
                          local_150.buffer = *(uint *)(local_150.data + uVar15);
                        }
                        else {
                          local_150.buffer = 0;
                          if (uVar15 < local_150.size) {
                            local_150.buffer = (uint)local_150.data[uVar15];
                          }
                          if (uVar15 + 1 < local_150.size) {
                            local_150.buffer =
                                 local_150.buffer | (uint)local_150.data[uVar15 + 1] << 8;
                          }
                          if (uVar15 + 2 < local_150.size) {
                            local_150.buffer =
                                 local_150.buffer | (uint)local_150.data[uVar15 + 2] << 0x10;
                          }
                        }
                        local_150.buffer = local_150.buffer >> ((byte)local_150.bp & 7);
                        auVar36 = ZEXT1664(auVar35);
                        uVar12 = huffmanDecodeSymbol(&local_150,(HuffmanTree *)local_58);
                        auVar35 = auVar36._0_16_;
                        if (uVar12 < 0x10) {
                          uVar18 = (uint)local_108;
                          pauVar21 = bitlen_00;
                          if (uVar13 < uVar18) {
                            uVar18 = 0;
                            pauVar21 = local_128;
                          }
                          *(uint *)((long)*pauVar21 + (ulong)(uVar13 - uVar18) * 4) = uVar12;
                          uVar16 = (ulong)(uVar13 + 1);
LAB_001277da:
                          if (local_150.bitsize < local_150.bp) {
                            uVar14 = 0x32;
                          }
                          iVar19 = 0;
                          if (local_150.bitsize < local_150.bp) {
                            iVar19 = 0xb;
                          }
                        }
                        else {
                          if (uVar12 == 0x12) {
                            uVar13 = local_150.buffer >> 7;
                            local_150.bp = local_150.bp + 7;
                            uVar16 = uVar16 & 0xffffffff;
                            puVar20 = (uint *)((long)*local_128 + uVar16 * 4);
                            iVar19 = (local_150.buffer & 0x7f) + 0xb;
                            do {
                              local_150.buffer = uVar13;
                              if (uVar25 <= uVar16) {
                                uVar14 = 0xf;
                                break;
                              }
                              puVar22 = (uint *)((long)*bitlen_00 +
                                                (ulong)(uint)(iVar29 + (int)uVar16) * 4);
                              if (uVar16 < local_108) {
                                puVar22 = puVar20;
                              }
                              *puVar22 = 0;
                              uVar16 = uVar16 + 1;
                              puVar20 = puVar20 + 1;
                              iVar19 = iVar19 + -1;
                            } while (iVar19 != 0);
                            goto LAB_001277da;
                          }
                          if (uVar12 == 0x11) {
                            uVar13 = local_150.buffer >> 3;
                            local_150.bp = local_150.bp + 3;
                            uVar16 = uVar16 & 0xffffffff;
                            puVar20 = (uint *)((long)*local_128 + uVar16 * 4);
                            iVar19 = (local_150.buffer & 7) + 3;
                            do {
                              local_150.buffer = uVar13;
                              if (uVar25 <= uVar16) {
                                uVar14 = 0xe;
                                break;
                              }
                              puVar22 = (uint *)((long)*bitlen_00 +
                                                (ulong)(uint)(iVar29 + (int)uVar16) * 4);
                              if (uVar16 < local_108) {
                                puVar22 = puVar20;
                              }
                              *puVar22 = 0;
                              uVar16 = uVar16 + 1;
                              puVar20 = puVar20 + 1;
                              iVar19 = iVar19 + -1;
                            } while (iVar19 != 0);
                            goto LAB_001277da;
                          }
                          if (uVar12 == 0x10) {
                            if (uVar13 == 0) {
                              iVar19 = 0xb;
                              uVar12 = 0;
                              uVar14 = 0x36;
                            }
                            else {
                              local_150.bp = local_150.bp + 2;
                              puVar20 = (uint *)((long)*bitlen_00 +
                                                (ulong)((uVar13 - 0x102) + (int)local_110) * 4);
                              if (uVar13 < (uint)local_118) {
                                puVar20 = (uint *)((long)*local_128 + (ulong)(uVar13 - 1) * 4);
                              }
                              uVar12 = *puVar20;
                              uVar16 = uVar16 & 0xffffffff;
                              puVar20 = (uint *)((long)*local_128 + uVar16 * 4);
                              iVar19 = (local_150.buffer & 3) + 3;
                              do {
                                if (uVar25 <= uVar16) {
                                  uVar14 = 0xd;
                                  break;
                                }
                                puVar22 = (uint *)((long)*bitlen_00 +
                                                  (ulong)(uint)(iVar29 + (int)uVar16) * 4);
                                if (uVar16 < local_108) {
                                  puVar22 = puVar20;
                                }
                                *puVar22 = uVar12;
                                uVar16 = uVar16 + 1;
                                puVar20 = puVar20 + 1;
                                iVar19 = iVar19 + -1;
                              } while (iVar19 != 0);
                              uVar12 = (uint)uVar16;
                              iVar19 = 0;
                              local_150.buffer = local_150.buffer >> 2;
                            }
                            uVar16 = (ulong)uVar12;
                            if (uVar13 != 0) goto LAB_001277da;
                          }
                          else {
                            iVar19 = 0xb;
                            uVar14 = 0x10;
                          }
                        }
                      } while (iVar19 == 0);
                      __s = local_128;
                      if (uVar14 == 0) {
                        if (*(int *)local_128[0x20] == 0) {
                          uVar14 = 0x40;
                        }
                        else {
                          uVar14 = HuffmanTree_makeFromLengths
                                             ((HuffmanTree *)local_e8,(uint *)local_128,0x120,0xf);
                          if (uVar14 == 0) {
                            uVar14 = HuffmanTree_makeFromLengths
                                               ((HuffmanTree *)local_a8,(uint *)bitlen_00,0x20,0xf);
                          }
                        }
                      }
                    }
                  }
                }
                in_ZMM6 = ZEXT1664(auVar35);
                free(bitlen);
                free(__s);
                free(bitlen_00);
                HuffmanTree_cleanup((HuffmanTree *)local_58);
                p = local_120;
              }
            }
          }
          do {
            if (uVar14 != 0) break;
            uVar16 = local_150.bp >> 3;
            if (uVar16 + 3 < local_150.size) {
              local_150.buffer = *(uint *)(local_150.data + uVar16);
            }
            else {
              local_150.buffer = 0;
              if (uVar16 < local_150.size) {
                local_150.buffer = (uint)local_150.data[uVar16];
              }
              if (uVar16 + 1 < local_150.size) {
                local_150.buffer = local_150.buffer | (uint)local_150.data[uVar16 + 1] << 8;
              }
              if (uVar16 + 2 < local_150.size) {
                local_150.buffer = local_150.buffer | (uint)local_150.data[uVar16 + 2] << 0x10;
              }
            }
            local_150.buffer = local_150.buffer >> ((byte)local_150.bp & 7);
            uVar13 = huffmanDecodeSymbol(&local_150,(HuffmanTree *)local_e8);
            if (uVar13 < 0x100) {
              uVar28 = ucvector_resize(p,p->size + 1);
              if (uVar28 == 0) {
                uVar14 = 0x53;
LAB_00127460:
                cVar26 = '\x03';
              }
              else {
                p->data[p->size - 1] = (uchar)uVar13;
LAB_001275e5:
                cVar26 = (local_150.bitsize < local_150.bp) * '\x03';
                if (local_150.bitsize < local_150.bp) {
                  uVar14 = 0x33;
                }
              }
            }
            else {
              if (0x11d < uVar13 || uVar13 == 0x100) {
                if (uVar13 != 0x100) {
                  uVar14 = 0x10;
                }
                goto LAB_00127460;
              }
              uVar16 = (ulong)(uVar13 - 0x101);
              uVar25 = (ulong)LENGTHBASE[uVar16];
              if (0xffffffffffffffeb < uVar16 - 0x1c) {
                local_150.bp = local_150.bp + LENGTHEXTRA[uVar16];
                uVar25 = uVar25 + (~(-1 << ((byte)LENGTHEXTRA[uVar16] & 0x1f)) & local_150.buffer);
              }
              uVar16 = local_150.bp >> 3;
              if (uVar16 + 4 < local_150.size) {
                bVar17 = (byte)local_150.bp & 7;
                local_150.buffer =
                     ((uint)local_150.data[uVar16 + 4] << 0x18) << (8 - bVar17 & 0x1f) |
                     *(uint *)(local_150.data + uVar16) >> bVar17;
              }
              else {
                local_150.buffer = 0;
                if (uVar16 < local_150.size) {
                  local_150.buffer = (uint)local_150.data[uVar16];
                }
                if (uVar16 + 1 < local_150.size) {
                  local_150.buffer = local_150.buffer | (uint)local_150.data[uVar16 + 1] << 8;
                }
                if (uVar16 + 2 < local_150.size) {
                  local_150.buffer = local_150.buffer | (uint)local_150.data[uVar16 + 2] << 0x10;
                }
                if (uVar16 + 3 < local_150.size) {
                  local_150.buffer = local_150.buffer | (uint)local_150.data[uVar16 + 3] << 0x18;
                }
                local_150.buffer = local_150.buffer >> ((byte)local_150.bp & 7);
              }
              uVar13 = huffmanDecodeSymbol(&local_150,(HuffmanTree *)local_a8);
              if (uVar13 < 0x1e) {
                uVar28 = DISTANCEBASE[uVar13];
                if (3 < uVar13) {
                  bVar17 = (byte)DISTANCEEXTRA[uVar13];
                  uVar12 = ~(-1 << (bVar17 & 0x1f)) & local_150.buffer;
                  local_150.buffer = local_150.buffer >> (bVar17 & 0x1f);
                  local_150.bp = local_150.bp + DISTANCEEXTRA[uVar13];
                  uVar28 = uVar28 + uVar12;
                }
                uVar16 = p->size;
                uVar15 = (ulong)uVar28;
                cVar26 = '\x03';
                lVar23 = uVar16 - uVar15;
                if (uVar16 < uVar15) {
                  uVar14 = 0x34;
                }
                else {
                  uVar13 = ucvector_resize(p,uVar16 + uVar25);
                  if (uVar13 != 0) {
                    lVar27 = uVar25 - uVar15;
                    if (uVar25 < uVar15 || lVar27 == 0) {
                      cVar26 = '\0';
                      bVar30 = true;
                      if (uVar25 != 0) {
                        memcpy(local_120->data + uVar16,local_120->data + lVar23,uVar25);
                      }
                    }
                    else {
                      if (uVar15 != 0) {
                        memcpy(local_120->data + uVar16,local_120->data + lVar23,uVar15);
                      }
                      lVar24 = uVar16 + uVar15;
                      do {
                        puVar1 = local_120->data + lVar23;
                        lVar23 = lVar23 + 1;
                        local_120->data[lVar24] = *puVar1;
                        lVar24 = lVar24 + 1;
                        lVar27 = lVar27 + -1;
                      } while (lVar27 != 0);
                      cVar26 = '\0';
                      bVar30 = true;
                    }
                    goto LAB_001275db;
                  }
                  uVar14 = 0x53;
                }
                bVar30 = false;
              }
              else {
                uVar14 = (uint)(uVar13 < 0x20) * 2 + 0x10;
                cVar26 = '\x03';
                bVar30 = false;
              }
LAB_001275db:
              p = local_120;
              if (bVar30) goto LAB_001275e5;
            }
          } while (cVar26 == '\0');
          HuffmanTree_cleanup((HuffmanTree *)local_e8);
          HuffmanTree_cleanup((HuffmanTree *)local_a8);
        }
        bVar30 = uVar14 == 0;
        uVar28 = local_100;
        uVar13 = local_fc;
        if (!bVar30) {
          uVar13 = uVar14;
        }
      }
    } while (bVar30);
  }
  return uVar13;
}

Assistant:

static unsigned lodepng_inflatev(ucvector* out,
  const unsigned char* in, size_t insize,
  const LodePNGDecompressSettings* settings) {
  unsigned BFINAL = 0;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, in, insize);

  if (error) return error;

  while (!BFINAL) {
    unsigned BTYPE;
    if (!ensureBits9(&reader, 3)) return 52; /*error, bit pointer will jump past memory*/
    BFINAL = readBits(&reader, 1);
    BTYPE = readBits(&reader, 2);

    if (BTYPE == 3) return 20; /*error: invalid BTYPE*/
    else if (BTYPE == 0) error = inflateNoCompression(out, &reader, settings); /*no compression*/
    else error = inflateHuffmanBlock(out, &reader, BTYPE); /*compression, BTYPE 01 or 10*/

    if (error) return error;
  }

  return error;
}